

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  int *piVar2;
  __int_type _Var3;
  RepeatedPtrFieldBase *in_RSI;
  Arena *in_RDI;
  
  if (((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i == 0) ||
     (*(int *)&(in_RDI->impl_).hint_._M_b._M_p ==
      *(int *)((long)&(in_RDI->impl_).hint_._M_b._M_p + 4))) {
    Reserve(in_RSI,(int)((ulong)in_RDI >> 0x20));
    piVar2 = (int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    *piVar2 = *piVar2 + 1;
  }
  else if (*(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i ==
           *(int *)((long)&(in_RDI->impl_).hint_._M_b._M_p + 4)) {
    cast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (*(void **)((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i +
                          8 + (long)*(int *)&(in_RDI->impl_).hint_._M_b._M_p * 8));
    GenericTypeHandler<google::protobuf::Message>::Delete((Message *)in_RSI,in_RDI);
  }
  else if (*(int *)&(in_RDI->impl_).hint_._M_b._M_p <
           *(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i) {
    *(undefined8 *)
     ((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i + 8 +
     (long)*(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i * 8) =
         *(undefined8 *)
          ((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i + 8 +
          (long)*(int *)&(in_RDI->impl_).hint_._M_b._M_p * 8);
    piVar2 = (int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    *piVar2 = *piVar2 + 1;
  }
  else {
    piVar2 = (int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    *piVar2 = *piVar2 + 1;
  }
  _Var3 = (in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
  iVar1 = *(int *)&(in_RDI->impl_).hint_._M_b._M_p;
  *(int *)&(in_RDI->impl_).hint_._M_b._M_p = iVar1 + 1;
  *(RepeatedPtrFieldBase **)(_Var3 + 8 + (long)iVar1 * 8) = in_RSI;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(rep_->elements[current_size_]),
                        arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}